

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_init(nk_buffer *b,nk_allocator *a,nk_size initial_size)

{
  void *pvVar1;
  nk_size initial_size_local;
  nk_allocator *a_local;
  nk_buffer *b_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f64,
                  "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
  }
  if (a == (nk_allocator *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f65,
                  "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
  }
  if (initial_size == 0) {
    __assert_fail("initial_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f66,
                  "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
  }
  if (((b != (nk_buffer *)0x0) && (a != (nk_allocator *)0x0)) && (initial_size != 0)) {
    nk_zero(b,0x78);
    b->type = NK_BUFFER_DYNAMIC;
    pvVar1 = (*a->alloc)(a->userdata,(void *)0x0,initial_size);
    (b->memory).ptr = pvVar1;
    (b->memory).size = initial_size;
    b->size = initial_size;
    b->grow_factor = 2.0;
    (b->pool).userdata = a->userdata;
    (b->pool).alloc = a->alloc;
    (b->pool).free = a->free;
  }
  return;
}

Assistant:

NK_API void
nk_buffer_init(struct nk_buffer *b, const struct nk_allocator *a,
    nk_size initial_size)
{
    NK_ASSERT(b);
    NK_ASSERT(a);
    NK_ASSERT(initial_size);
    if (!b || !a || !initial_size) return;

    nk_zero(b, sizeof(*b));
    b->type = NK_BUFFER_DYNAMIC;
    b->memory.ptr = a->alloc(a->userdata,0, initial_size);
    b->memory.size = initial_size;
    b->size = initial_size;
    b->grow_factor = 2.0f;
    b->pool = *a;
}